

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int getregion(region *rp)

{
  int iVar1;
  bool bVar2;
  long bsize;
  long fsize;
  line *blp;
  line *flp;
  region *rp_local;
  
  if (curwp->w_markp == (line *)0x0) {
    dobeep();
    ewprintf("No mark set in this window");
    rp_local._4_4_ = 0;
  }
  else if (curwp->w_dotp == curwp->w_markp) {
    rp->r_linep = curwp->w_dotp;
    rp->r_lineno = curwp->w_dotline;
    if (curwp->w_doto < curwp->w_marko) {
      rp->r_offset = curwp->w_doto;
      rp->r_size = curwp->w_marko - curwp->w_doto;
    }
    else {
      rp->r_offset = curwp->w_marko;
      rp->r_size = curwp->w_doto - curwp->w_marko;
    }
    rp_local._4_4_ = 1;
  }
  else {
    fsize = (long)curwp->w_dotp;
    iVar1 = curwp->w_doto;
    bsize = (long)((((line *)fsize)->l_used - curwp->w_doto) + 1);
    blp = (line *)fsize;
    do {
      do {
        bVar2 = true;
        if (blp->l_fp == curbp->b_headp) {
          bVar2 = *(line **)(fsize + 8) != curbp->b_headp;
        }
        if (!bVar2) {
          dobeep();
          ewprintf("Bug: lost mark");
          return 0;
        }
        if (blp->l_fp != curbp->b_headp) {
          blp = blp->l_fp;
          if (blp == curwp->w_markp) {
            rp->r_linep = curwp->w_dotp;
            rp->r_offset = curwp->w_doto;
            rp->r_lineno = curwp->w_dotline;
            iVar1 = setsize(rp,(int)bsize + curwp->w_marko);
            return iVar1;
          }
          bsize = (blp->l_used + 1) + bsize;
        }
      } while (*(line **)(fsize + 8) == curbp->b_headp);
      fsize = *(long *)(fsize + 8);
      iVar1 = ((line *)fsize)->l_used + 1 + iVar1;
    } while ((line *)fsize != curwp->w_markp);
    rp->r_linep = (line *)fsize;
    rp->r_offset = curwp->w_marko;
    rp->r_lineno = curwp->w_markline;
    rp_local._4_4_ = setsize(rp,iVar1 - curwp->w_marko);
  }
  return rp_local._4_4_;
}

Assistant:

static int
getregion(struct region *rp)
{
	struct line	*flp, *blp;
	long	 fsize, bsize;

	if (curwp->w_markp == NULL) {
		dobeep();
		ewprintf("No mark set in this window");
		return (FALSE);
	}

	/* "r_size" always ok */
	if (curwp->w_dotp == curwp->w_markp) {
		rp->r_linep = curwp->w_dotp;
		rp->r_lineno = curwp->w_dotline;
		if (curwp->w_doto < curwp->w_marko) {
			rp->r_offset = curwp->w_doto;
			rp->r_size = (RSIZE)(curwp->w_marko - curwp->w_doto);
		} else {
			rp->r_offset = curwp->w_marko;
			rp->r_size = (RSIZE)(curwp->w_doto - curwp->w_marko);
		}
		return (TRUE);
	}
	/* get region size */
	flp = blp = curwp->w_dotp;
	bsize = curwp->w_doto;
	fsize = llength(flp) - curwp->w_doto + 1;
	while (lforw(flp) != curbp->b_headp || lback(blp) != curbp->b_headp) {
		if (lforw(flp) != curbp->b_headp) {
			flp = lforw(flp);
			if (flp == curwp->w_markp) {
				rp->r_linep = curwp->w_dotp;
				rp->r_offset = curwp->w_doto;
				rp->r_lineno = curwp->w_dotline;
				return (setsize(rp,
				    (RSIZE)(fsize + curwp->w_marko)));
			}
			fsize += llength(flp) + 1;
		}
		if (lback(blp) != curbp->b_headp) {
			blp = lback(blp);
			bsize += llength(blp) + 1;
			if (blp == curwp->w_markp) {
				rp->r_linep = blp;
				rp->r_offset = curwp->w_marko;
				rp->r_lineno = curwp->w_markline;
				return (setsize(rp,
				    (RSIZE)(bsize - curwp->w_marko)));
			}
		}
	}
	dobeep();
	ewprintf("Bug: lost mark");
	return (FALSE);
}